

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O1

string * __thiscall
soul::Program::ProgramImpl::getVariableNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Module *context,Variable *v)

{
  pool_ref<soul::heart::Variable> *ppVar1;
  string *psVar2;
  pointer pcVar3;
  pointer ppVar4;
  pool_ref<soul::heart::Variable> *ppVar5;
  pointer ppVar6;
  bool bVar7;
  string local_50;
  
  if ((v->role & ~external) == state) {
    ppVar6 = (this->modules).
             super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->modules).
             super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = ppVar6 == ppVar4;
    if (!bVar7) {
      ppVar5 = (ppVar6->object->stateVariables).stateVariables.items;
      ppVar1 = ppVar5 + (ppVar6->object->stateVariables).stateVariables.numActive;
      ppVar5 = std::
               __find_if<soul::pool_ref<soul::heart::Variable>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Variable_const>>
                         (ppVar5,ppVar1,v);
      if (ppVar5 == ppVar1) {
        do {
          ppVar6 = ppVar6 + 1;
          bVar7 = ppVar6 == ppVar4;
          if (bVar7) goto LAB_001c7b97;
          ppVar5 = (ppVar6->object->stateVariables).stateVariables.items;
          ppVar1 = ppVar5 + (ppVar6->object->stateVariables).stateVariables.numActive;
          ppVar5 = std::
                   __find_if<soul::pool_ref<soul::heart::Variable>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Variable_const>>
                             (ppVar5,ppVar1,v);
        } while (ppVar5 == ppVar1);
      }
      psVar2 = (v->name).name;
      if (ppVar6->object == context) {
        if (psVar2 == (string *)0x0) {
          throwInternalCompilerError("isValid()","toString",0x23);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = (psVar2->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar2->_M_string_length);
      }
      else {
        if (psVar2 == (string *)0x0) goto LAB_001c7cb9;
        TokenisedPathString::join(&local_50,&ppVar6->object->fullName,psVar2);
        stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar7) {
        return __return_storage_ptr__;
      }
    }
  }
LAB_001c7b97:
  psVar2 = (v->name).name;
  if (psVar2 != (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar2->_M_string_length);
    return __return_storage_ptr__;
  }
LAB_001c7cb9:
  throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
}

Assistant:

std::string getVariableNameWithQualificationIfNeeded (const Module& context, const heart::Variable& v) const
    {
        if (v.isState())
        {
            for (auto& m : modules)
            {
                if (contains (m->stateVariables.get(), v))
                {
                    if (m == context)
                        return v.name.toString();

                    return stripRootNamespaceFromQualifiedPath (TokenisedPathString::join (m->fullName, v.name));
                }
            }
        }

        return v.name;
    }